

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_values.cpp
# Opt level: O3

bool ON_Internal_RemoveCommonFactors(double rel_zero_tol,double factor,double *x,double *y)

{
  undefined1 in_AL;
  undefined1 extraout_AL;
  undefined1 extraout_AL_00;
  undefined1 extraout_AL_01;
  undefined8 extraout_RAX;
  undefined8 uVar1;
  undefined8 extraout_RAX_00;
  double dVar2;
  double dVar3;
  double local_30;
  
  dVar2 = *x;
  if (((dVar2 <= 0.0) || (rel_zero_tol <= 0.0)) || (dVar3 = *y, dVar3 <= 0.0)) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_string_values.cpp"
               ,0x563,"","Invalid input parameters.");
    return (bool)extraout_AL;
  }
  if ((((rel_zero_tol != 1.0) || (NAN(rel_zero_tol))) &&
      ((dVar2 < 4503599627370496.0 &&
       ((dVar3 < 4503599627370496.0 && (dVar2 * 1e-14 < rel_zero_tol)))))) &&
     (dVar3 * 1e-14 < rel_zero_tol)) {
    local_30 = ON_InternalQuotient(1e-14,dVar2,rel_zero_tol);
    dVar2 = floor(local_30);
    in_AL = extraout_AL_00;
    if ((local_30 == dVar2) && (!NAN(local_30) && !NAN(dVar2))) {
      dVar2 = ON_InternalQuotient(1e-14,*y,rel_zero_tol);
      dVar3 = floor(dVar2);
      in_AL = (undefined1)extraout_RAX;
      if ((dVar2 == dVar3) && (!NAN(dVar2) && !NAN(dVar3))) {
        uVar1 = extraout_RAX;
        while ((in_AL = (undefined1)uVar1, rel_zero_tol < 1.0 || ((local_30 < *x && (dVar2 < *y)))))
        {
          *x = local_30;
          *y = dVar2;
          if (rel_zero_tol < 2.0) {
            return (bool)in_AL;
          }
          if (dVar2 < rel_zero_tol * 0.9999999999999991) {
            return (bool)in_AL;
          }
          if (*x < rel_zero_tol * 0.9999999999999991) {
            return (bool)in_AL;
          }
          local_30 = ON_InternalQuotient(1e-14,*x,rel_zero_tol);
          dVar2 = floor(local_30);
          if (local_30 != dVar2) {
            return (bool)extraout_AL_01;
          }
          if (NAN(local_30) || NAN(dVar2)) {
            return (bool)extraout_AL_01;
          }
          dVar2 = ON_InternalQuotient(1e-14,*y,rel_zero_tol);
          dVar3 = floor(dVar2);
          if (dVar2 != dVar3) {
            return (bool)(char)extraout_RAX_00;
          }
          uVar1 = extraout_RAX_00;
          if (NAN(dVar2) || NAN(dVar3)) {
            return (bool)(char)extraout_RAX_00;
          }
        }
      }
    }
  }
  return (bool)in_AL;
}

Assistant:

static bool ON_Internal_RemoveCommonFactors(const double rel_zero_tol, const double factor, double& x, double& y)
{
  if (false == (x > 0.0 && y > 0.0 && factor > 0.0 && rel_zero_tol >= 0.0 && rel_zero_tol < 0.01))
  {
    ON_ERROR("Invalid input parameters.");
    return false;
  }
  if (1.0 == factor)
    return true; // nothing to do

  if (!(x < 1.0 / ON_EPSILON && y < 1.0 / ON_EPSILON))
  {
    // x or y is too big for this code to work with IEEE double arithmetic.
    return false;
  }

  const double fat_eps = 4.0*ON_EPSILON;
  const double factor_tol = (rel_zero_tol > fat_eps) ? rel_zero_tol : fat_eps;
  if (!(factor > x*factor_tol && factor > y*factor_tol))
  {
    // factor is too small for the ON_ScaleValue context where this
    // function is designed to be used.
    return false;
  }

  bool rc = false;
  for (;;)
  {
    const double s = ON_InternalQuotient(factor_tol,x,factor);
    if (!(s == floor(s)))
      break;


    const double t = ON_InternalQuotient(factor_tol,y,factor);
    if (!(t == floor(t)))
      break;
    
    if (factor >= 1.0)
    {
      if (!(s < x && t < y))
        break;
    }

    rc = true;
    x = s;
    y = t;

    if ( !(factor >= 2.0 && x >= factor*(1.0-fat_eps) && y >= factor*(1.0-fat_eps)) )
      break;
  }

  return rc;
}